

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

xml_string * xml_parse_tag_end(xml_parser *parser)

{
  size_t sVar1;
  byte bVar2;
  uint8_t uVar3;
  ushort **ppuVar4;
  xml_string *name;
  size_t sStack_28;
  uint8_t current;
  size_t length;
  size_t start;
  xml_parser *parser_local;
  
  sVar1 = parser->position;
  sStack_28 = 0;
  while (((sVar1 + sStack_28 < parser->length && (bVar2 = xml_parser_peek(parser,0), bVar2 != 0x3e))
         && (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)(uint)bVar2] & 0x2000) == 0))) {
    xml_parser_consume(parser,1);
    sStack_28 = sStack_28 + 1;
  }
  uVar3 = xml_parser_peek(parser,0);
  if (uVar3 == '>') {
    xml_parser_consume(parser,1);
    parser_local = (xml_parser *)malloc(0x10);
    parser_local->buffer = parser->buffer + sVar1;
    parser_local->position = sStack_28;
  }
  else {
    xml_parser_error(parser,CURRENT_CHARACTER,"xml_parse_tag_end::expected tag end");
    parser_local = (xml_parser *)0x0;
  }
  return (xml_string *)parser_local;
}

Assistant:

static struct xml_string* xml_parse_tag_end(struct xml_parser* parser) {
	xml_parser_info(parser, "tag_end");
	size_t start = parser->position;
	size_t length = 0;

	/* Parse until `>' or a whitespace is reached
	 */
	while (start + length < parser->length) {
		uint8_t current = xml_parser_peek(parser, CURRENT_CHARACTER);

		if (('>' == current) || isspace(current)) {
			break;
		} else {
			xml_parser_consume(parser, 1);
			length++;
		}
	}

	/* Consume `>'
	 */
	if ('>' != xml_parser_peek(parser, CURRENT_CHARACTER)) {
		xml_parser_error(parser, CURRENT_CHARACTER, "xml_parse_tag_end::expected tag end");
		return 0;
	}
	xml_parser_consume(parser, 1);

	/* Return parsed tag name
	 */
	struct xml_string* name = malloc(sizeof(struct xml_string));
	name->buffer = &parser->buffer[start];
	name->length = length;
	return name;
}